

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_params.cpp
# Opt level: O1

void __thiscall
libtorrent::session_params::session_params
          (session_params *this,settings_pack *sp,
          vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
          *exts)

{
  _Rb_tree_header *p_Var1;
  
  settings_pack::settings_pack(&this->settings,sp);
  (this->flags).m_val = '\0';
  (this->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (exts->
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (exts->
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (exts->
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (exts->
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (exts->
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (exts->
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dht_state).nodes6.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->dht_storage_constructor).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dht_storage_constructor).super__Function_base._M_functor + 8) = 0;
  (this->dht_storage_constructor).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dht_state).nodes6.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dht_state).nodes6.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dht_state).nodes.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dht_state).nodes.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dht_state).nids.
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dht_state).nodes.
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dht_state).nids.
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dht_state).nids.
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(code **)&(this->dht_storage_constructor).super__Function_base._M_functor =
       dht::dht_default_storage_constructor;
  (this->dht_storage_constructor)._M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&),_std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(*)(const_libtorrent::settings_interface_&)>
       ::_M_invoke;
  (this->dht_storage_constructor).super__Function_base._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&),_std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(*)(const_libtorrent::settings_interface_&)>
       ::_M_manager;
  *(undefined8 *)&(this->disk_io_constructor).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->disk_io_constructor).super__Function_base._M_functor + 8) = 0;
  (this->disk_io_constructor).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->disk_io_constructor)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = &(this->ext_state)._M_t._M_impl.super__Rb_tree_header;
  (this->ext_state)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ext_state)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ext_state)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ext_state)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ext_state)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ip_filter::ip_filter(&this->ip_filter);
  (this->dht_settings).max_peers_reply = 100;
  (this->dht_settings).search_branching = 5;
  (this->dht_settings).max_fail_count = 0x14;
  (this->dht_settings).max_torrents = 2000;
  (this->dht_settings).max_dht_items = 700;
  (this->dht_settings).max_peers = 500;
  (this->dht_settings).max_torrent_search_reply = 0x14;
  (this->dht_settings).restrict_routing_ips = true;
  (this->dht_settings).restrict_search_ips = true;
  (this->dht_settings).extended_routing_table = true;
  (this->dht_settings).aggressive_lookups = true;
  (this->dht_settings).privacy_lookups = false;
  (this->dht_settings).enforce_node_id = false;
  (this->dht_settings).ignore_dark_internet = true;
  (this->dht_settings).block_timeout = 300;
  (this->dht_settings).block_ratelimit = 5;
  (this->dht_settings).read_only = false;
  (this->dht_settings).item_lifetime = 0;
  (this->dht_settings).upload_rate_limit = 8000;
  (this->dht_settings).sample_infohashes_interval = 0x5460;
  (this->dht_settings).max_infohashes_sample_count = 0x14;
  return;
}

Assistant:

session_params::session_params(settings_pack const& sp // NOLINT
	, std::vector<std::shared_ptr<plugin>> exts)
	: settings(sp)
	, extensions(std::move(exts))
#ifndef TORRENT_DISABLE_DHT
	, dht_storage_constructor(dht::dht_default_storage_constructor)
#endif
	{}